

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Easy.cpp
# Opt level: O0

void __thiscall curlpp::Easy::setOpt(Easy *this,auto_ptr<curlpp::OptionBase> *option)

{
  element_type *peVar1;
  element_type *peVar2;
  auto_ptr<curlpp::OptionBase> *in_RSI;
  long in_RDI;
  OptionBase *in_stack_00000038;
  OptionList *in_stack_00000040;
  
  peVar1 = std::auto_ptr<curlpp::OptionBase>::operator->(in_RSI);
  peVar2 = std::auto_ptr<curlpp::internal::CurlHandle>::get
                     ((auto_ptr<curlpp::internal::CurlHandle> *)(in_RDI + 8));
  (*peVar1->_vptr_OptionBase[5])(peVar1,peVar2);
  std::auto_ptr<curlpp::OptionBase>::release(in_RSI);
  internal::OptionList::setOpt(in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void
curlpp::Easy::setOpt(std::auto_ptr<OptionBase> option)
{
	option->updateHandleToMe(mCurl.get());
	mOptions.setOpt(option.release());    
}